

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O3

void __thiscall
QAccessibleTextEdit::scrollToSubstring(QAccessibleTextEdit *this,int startIndex,int endIndex)

{
  char cVar1;
  int iVar2;
  int iVar3;
  QWidget *this_00;
  QScrollBar *pQVar4;
  int iVar5;
  Representation ray;
  int iVar6;
  long in_FS_OFFSET;
  QRect QVar7;
  QRect QVar8;
  QTextCursor cursor;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  undefined1 *local_70;
  void *local_68;
  double *local_60;
  char *local_58;
  char *local_50;
  QMetaTypeInterface *local_48;
  undefined8 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QAccessibleWidget::widget((QAccessibleWidget *)this);
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)&(this->super_QAccessibleTextWidget).super_QAccessibleWidget + 0x158))
            ((QTextCursor *)&local_70,this);
  iVar2 = (int)(QTextCursor *)&local_70;
  QTextCursor::setPosition(iVar2,startIndex);
  QVar7 = QTextEdit::cursorRect((QTextEdit *)this_00,(QTextCursor *)&local_70);
  QTextCursor::setPosition(iVar2,endIndex);
  QVar8 = QTextEdit::cursorRect((QTextEdit *)this_00,(QTextCursor *)&local_70);
  pQVar4 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this_00);
  iVar2 = QAbstractSlider::value(&pQVar4->super_QAbstractSlider);
  iVar5 = iVar2 + QVar7.x1.m_i.m_i;
  pQVar4 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this_00);
  iVar3 = QAbstractSlider::value(&pQVar4->super_QAbstractSlider);
  iVar6 = QVar7.y1.m_i.m_i + iVar3;
  local_90 = (double)iVar5;
  local_60 = &local_90;
  local_88 = (double)iVar6;
  local_80 = (double)(((long)(QVar8.x2.m_i.m_i + iVar2) - (long)iVar5) + 1);
  local_78 = (double)(((long)(QVar8.y2.m_i.m_i + iVar3) - (long)iVar6) + 1);
  local_68 = (void *)0x0;
  local_58 = (char *)0x0;
  local_50 = "QRectF";
  local_48 = (QMetaTypeInterface *)0x0;
  local_40 = &QtPrivate::QMetaTypeInterfaceWrapper<QRectF>::metaType;
  cVar1 = QMetaObject::invokeMethodImpl
                    (&this_00->super_QObject,"_q_ensureVisible",AutoConnection,2,&local_68,&local_58
                     ,&local_48);
  if (cVar1 == '\0') {
    scrollToSubstring();
  }
  QTextCursor::~QTextCursor((QTextCursor *)&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAccessibleTextEdit::scrollToSubstring(int startIndex, int endIndex)
{
    QTextEdit *edit = textEdit();

    QTextCursor cursor = textCursor();
    cursor.setPosition(startIndex);
    QRect r = edit->cursorRect(cursor);

    cursor.setPosition(endIndex);
    r.setBottomRight(edit->cursorRect(cursor).bottomRight());

    r.moveTo(r.x() + edit->horizontalScrollBar()->value(),
             r.y() + edit->verticalScrollBar()->value());

    // E V I L, but ensureVisible is not public
    if (Q_UNLIKELY(!QMetaObject::invokeMethod(edit, "_q_ensureVisible", Q_ARG(QRectF, r))))
        qWarning("AccessibleTextEdit::scrollToSubstring failed!");
}